

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

void __thiscall
CVmObjStringBuffer::splice_text
          (CVmObjStringBuffer *this,vm_obj_id_t self,int32_t idx,int32_t del_chars,char *src,
          int32_t ins_bytes,int undo)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  size_t bufcnt;
  byte *pbVar4;
  int idx_00;
  int32_t old_len;
  
  uVar3 = 0;
  if (0 < ins_bytes) {
    uVar3 = 0;
    pbVar4 = (byte *)src;
    do {
      pbVar4 = pbVar4 + (ulong)(((*pbVar4 >> 5 & 1) != 0) + 1 & (uint)(*pbVar4 >> 7) * 3) + 1;
      uVar3 = uVar3 + 1;
    } while (pbVar4 < src + ins_bytes);
  }
  piVar2 = (int *)(this->super_CVmObject).ext_;
  idx_00 = 0;
  if ((-1 < idx) && (iVar1 = *piVar2, idx_00 = idx, iVar1 < idx)) {
    idx_00 = iVar1;
  }
  bufcnt = 0;
  old_len = 0;
  if ((-1 < del_chars) && (iVar1 = *piVar2, old_len = iVar1 - idx_00, idx_00 + del_chars <= iVar1))
  {
    old_len = del_chars;
  }
  if (0 < (int)uVar3) {
    bufcnt = (size_t)uVar3;
  }
  if (undo != 0) {
    add_undo_rec(this,self,STRBUF_UNDO_REPL,idx_00,old_len,(int32_t)bufcnt);
  }
  splice_move(this,idx_00,old_len,(int32_t)bufcnt);
  utf8_ptr::to_wchar((wchar_t *)((this->super_CVmObject).ext_ + (long)idx_00 * 4 + 0xc),bufcnt,src,
                     (long)ins_bytes);
  return;
}

Assistant:

void CVmObjStringBuffer::splice_text(VMG_ vm_obj_id_t self,
                                     int32_t idx, int32_t del_chars,
                                     const char *src, int32_t ins_bytes,
                                     int undo)
{
    /* figure the character length of the string */
    utf8_ptr p((char *)src);
    int32_t ins_chars = p.len(ins_bytes);

    /* check arguments */
    adjust_args(&idx, &del_chars, &ins_chars);

    /* if desired, save undo */
    if (undo)
        add_undo_rec(vmg_ self, STRBUF_UNDO_REPL, idx, del_chars, ins_chars);

    /* open up a gap in the buffer */
    splice_move(vmg_ idx, del_chars, ins_chars);

    /* decode characters into the buffer */
    p.to_wchar(get_ext()->buf + idx, ins_chars, src, ins_bytes);
}